

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

_Bool psftp_eof(Seat *seat)

{
  if (sent_eof == '\0') {
    seat_connection_fatal(psftp_seat,"Received unexpected end-of-file from SFTP server");
  }
  return false;
}

Assistant:

static bool psftp_eof(Seat *seat)
{
    /*
     * We expect to be the party deciding when to close the
     * connection, so if we see EOF before we sent it ourselves, we
     * should panic.
     */
    if (!sent_eof) {
        seat_connection_fatal(
            psftp_seat, "Received unexpected end-of-file from SFTP server");
    }
    return false;
}